

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_test.cc
# Opt level: O0

void __thiscall
AV1Kmeans::AV1KmeansTest2_CheckOutput_Test::~AV1KmeansTest2_CheckOutput_Test
          (AV1KmeansTest2_CheckOutput_Test *this)

{
  void *in_RDI;
  
  ~AV1KmeansTest2_CheckOutput_Test((AV1KmeansTest2_CheckOutput_Test *)0x9eeea8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_P(AV1KmeansTest2, CheckOutput) {
  // centroids = 2..8
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 2);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 3);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 4);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 5);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 6);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 7);
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1), 8);
}